

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O1

uint8_t * __thiscall
aeron::util::MemoryMappedFile::doMapping
          (MemoryMappedFile *this,size_t length,FileHandle fd,size_t offset)

{
  uint8_t *puVar1;
  SourcedException *this_00;
  char *pcVar2;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  
  puVar1 = (uint8_t *)mmap64((void *)0x0,length,3,1,fd.handle,offset);
  if (puVar1 != (uint8_t *)0xffffffffffffffff) {
    return puVar1;
  }
  this_00 = (SourcedException *)__cxa_allocate_exception(0x48);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"failed to Memory Map File","");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "uint8_t *aeron::util::MemoryMappedFile::doMapping(size_t, FileHandle, size_t)","");
  pcVar2 = past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/util/MemoryMappedFile.cpp"
                      );
  std::__cxx11::string::string((string *)&local_48,pcVar2,&local_89);
  SourcedException::SourcedException(this_00,&local_68,&local_88,&local_48,0x120);
  *(undefined ***)this_00 = &PTR__SourcedException_00164b58;
  __cxa_throw(this_00,&IOException::typeinfo,SourcedException::~SourcedException);
}

Assistant:

uint8_t* MemoryMappedFile::doMapping(size_t length, FileHandle fd, size_t offset)
{
    void* memory = ::mmap(NULL, length, PROT_READ|PROT_WRITE, MAP_SHARED, fd.handle, static_cast<off_t>(offset));

    if (MAP_FAILED == memory)
    {
        throw IOException("failed to Memory Map File", SOURCEINFO);
    }

    return static_cast<uint8_t*>(memory);
}